

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_qrshl_s64_aarch64(CPUARMState_conflict *env,uint64_t valop,uint64_t shiftop)

{
  byte bVar1;
  long lVar2;
  int64_t tmp;
  int64_t val;
  int8_t shift;
  uint64_t shiftop_local;
  uint64_t valop_local;
  CPUARMState_conflict *env_local;
  
  bVar1 = (byte)shiftop;
  if ((char)bVar1 < '@') {
    if ((char)bVar1 < -0x3f) {
      tmp = 0;
    }
    else if ((char)bVar1 < '\0') {
      lVar2 = (long)valop >> (0xff - bVar1 & 0x3f);
      if (lVar2 == 0x7fffffffffffffff) {
        tmp = 0x4000000000000000;
      }
      else {
        tmp = lVar2 + 1 >> 1;
      }
    }
    else {
      tmp = valop << (bVar1 & 0x3f);
      if (tmp >> (bVar1 & 0x3f) != valop) {
        (env->vfp).qc[0] = 1;
        tmp = (long)valop >> 0x3f ^ 0x7fffffffffffffff;
      }
    }
  }
  else {
    tmp = valop;
    if (valop != 0) {
      (env->vfp).qc[0] = 1;
      tmp = (long)valop >> 0x3f ^ 0x7fffffffffffffff;
    }
  }
  return tmp;
}

Assistant:

uint64_t HELPER(neon_qrshl_s64)(CPUARMState *env, uint64_t valop, uint64_t shiftop)
{
    int8_t shift = (uint8_t)shiftop;
    int64_t val = valop;

    if (shift >= 64) {
        if (val) {
            SET_QC();
            val = (val >> 63) ^ ~SIGNBIT64;
        }
    } else if (shift <= -64) {
        val = 0;
    } else if (shift < 0) {
        val >>= (-shift - 1);
        if (val == INT64_MAX) {
            /* In this case, it means that the rounding constant is 1,
             * and the addition would overflow. Return the actual
             * result directly.  */
            val = 0x4000000000000000ULL;
        } else {
            val++;
            val >>= 1;
        }
    } else {
        int64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = (tmp >> 63) ^ ~SIGNBIT64;
        }
    }
    return val;
}